

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Constr.c
# Opt level: O2

Vec_Int_t * Llb_ManDeriveConstraints(Aig_Man_t *p)

{
  int iVar1;
  DdManager *dd;
  Vec_Int_t *vCands;
  Vec_Int_t *vNodes;
  Vec_Int_t *local_20;
  
  if (p->nTruePos == 1) {
    dd = Llb_ManConstructGlobalBdds(p);
    vCands = Llb_ManComputeBaseCase(p,dd);
    local_20 = vCands;
    iVar1 = Llb_ManCountEntries(vCands);
    if (0 < iVar1) {
      Llb_ManComputeIndCase(p,dd,vCands);
    }
    iVar1 = Llb_ManCountEntries(vCands);
    if (iVar1 == 0) {
      Vec_IntFreeP(&local_20);
      vCands = local_20;
    }
    Llb_ManDerefenceBdds(p,dd);
    Extra_StopManager(dd);
  }
  else {
    vCands = (Vec_Int_t *)0x0;
    printf("The AIG has %d property outputs.\n");
  }
  return vCands;
}

Assistant:

Vec_Int_t * Llb_ManDeriveConstraints( Aig_Man_t * p )
{
    DdManager * dd;
    Vec_Int_t * vNodes;
    if ( Saig_ManPoNum(p) != 1 )
    {
        printf( "The AIG has %d property outputs.\n", Saig_ManPoNum(p) );
        return NULL;
    }
    assert( Saig_ManPoNum(p) == 1 );
    dd = Llb_ManConstructGlobalBdds( p );
    vNodes = Llb_ManComputeBaseCase( p, dd );
    if ( Llb_ManCountEntries(vNodes) > 0 )
        Llb_ManComputeIndCase( p, dd, vNodes );
    if ( Llb_ManCountEntries(vNodes) == 0 )
        Vec_IntFreeP( &vNodes );
    Llb_ManDerefenceBdds( p, dd );
    Extra_StopManager( dd );
    return vNodes;
}